

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

void help(void)

{
  long lVar1;
  FILE *pFVar2;
  char *pcVar3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>_>
  *__x;
  _Base_ptr p_Var5;
  gen_map_t gen_map;
  char *local_a8 [2];
  char local_98 [16];
  _Rb_tree_node_base *local_88;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>_>
  local_60;
  
  fwrite("Usage: thrift [options] file\n",0x1d,1,_stderr);
  fwrite("Options:\n",9,1,_stderr);
  fwrite("  -version    Print the compiler version\n",0x29,1,_stderr);
  fwrite("  -o dir      Set the output directory for gen-* packages\n",0x3a,1,_stderr);
  fwrite("               (default: current directory)\n",0x2c,1,_stderr);
  fwrite("  -out dir    Set the ouput location for generated files.\n",0x3a,1,_stderr);
  fwrite("               (no gen-* folder will be created)\n",0x31,1,_stderr);
  fwrite("  -I dir      Add a directory to the list of directories\n",0x39,1,_stderr);
  fwrite("                searched for include directives\n",0x30,1,_stderr);
  fwrite("  -nowarn     Suppress all compiler warnings (BAD!)\n",0x34,1,_stderr);
  fwrite("  -strict     Strict compiler warnings on\n",0x2a,1,_stderr);
  fwrite("  -v[erbose]  Verbose mode\n",0x1b,1,_stderr);
  fwrite("  -r[ecurse]  Also generate included files\n",0x2b,1,_stderr);
  fwrite("  -debug      Parse debug trace to stdout\n",0x2a,1,_stderr);
  fwrite("  --allow-neg-keys  Allow negative field keys (Used to preserve protocol\n",0x49,1,_stderr
        );
  fwrite("                compatibility with older .thrift files)\n",0x38,1,_stderr);
  fwrite("  --allow-64bit-consts  Do not print warnings about using 64-bit constants\n",0x4b,1,
         _stderr);
  fwrite("  --gen STR   Generate code with a dynamically-registered generator.\n",0x45,1,_stderr);
  fwrite("                STR has the form language[:key1=val1[,key2[,key3=val3]]].\n",0x4a,1,
         _stderr);
  fwrite("                Keys and values are options passed to the generator.\n",0x45,1,_stderr);
  fwrite("                Many options will not require values.\n",0x36,1,_stderr);
  fputc(10,_stderr);
  fwrite("Options related to audit operation\n",0x23,1,_stderr);
  fwrite("   --audit OldFile   Old Thrift file to be audited with \'file\'\n",0x3f,1,_stderr);
  fwrite("  -Iold dir    Add a directory to the list of directories\n",0x3a,1,_stderr);
  fwrite("                searched for include directives for old thrift file\n",0x44,1,_stderr);
  fwrite("  -Inew dir    Add a directory to the list of directories\n",0x3a,1,_stderr);
  fwrite("                searched for include directives for new thrift file\n",0x44,1,_stderr);
  fputc(10,_stderr);
  fwrite("Available generators (and options):\n",0x24,1,_stderr);
  __x = &t_generator_registry::get_generator_map_abi_cxx11_()->_M_t;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>_>
  ::_Rb_tree(&local_60,__x);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pFVar2 = _stderr;
      lVar1 = *(long *)(*(long *)(p_Var5 + 2) + 8);
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a8,lVar1,*(long *)(*(long *)(p_Var5 + 2) + 0x10) + lVar1);
      pcVar3 = local_a8[0];
      lVar1 = *(long *)(*(long *)(p_Var5 + 2) + 0x28);
      local_88 = p_Var5;
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,lVar1,*(long *)(*(long *)(p_Var5 + 2) + 0x30) + lVar1);
      fprintf(pFVar2,"  %s (%s):\n",pcVar3,local_80[0]);
      if (local_80[0] != local_70) {
        operator_delete(local_80[0]);
      }
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0]);
      }
      p_Var4 = local_88;
      pFVar2 = _stderr;
      lVar1 = *(long *)(*(long *)(local_88 + 2) + 0x48);
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a8,lVar1,*(long *)(*(long *)(local_88 + 2) + 0x50) + lVar1);
      fputs(local_a8[0],pFVar2);
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0]);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var5 != &local_60._M_impl.super__Rb_tree_header);
  }
  exit(1);
}

Assistant:

void help() {
    fprintf(stderr, "Usage: thrift [options] file\n");
    fprintf(stderr, "Options:\n");
    fprintf(stderr, "  -version    Print the compiler version\n");
    fprintf(stderr, "  -o dir      Set the output directory for gen-* packages\n");
    fprintf(stderr, "               (default: current directory)\n");
    fprintf(stderr, "  -out dir    Set the ouput location for generated files.\n");
    fprintf(stderr, "               (no gen-* folder will be created)\n");
    fprintf(stderr, "  -I dir      Add a directory to the list of directories\n");
    fprintf(stderr, "                searched for include directives\n");
    fprintf(stderr, "  -nowarn     Suppress all compiler warnings (BAD!)\n");
    fprintf(stderr, "  -strict     Strict compiler warnings on\n");
    fprintf(stderr, "  -v[erbose]  Verbose mode\n");
    fprintf(stderr, "  -r[ecurse]  Also generate included files\n");
    fprintf(stderr, "  -debug      Parse debug trace to stdout\n");
    fprintf(stderr,
            "  --allow-neg-keys  Allow negative field keys (Used to "
            "preserve protocol\n");
    fprintf(stderr, "                compatibility with older .thrift files)\n");
    fprintf(stderr, "  --allow-64bit-consts  Do not print warnings about using 64-bit constants\n");
    fprintf(stderr, "  --gen STR   Generate code with a dynamically-registered generator.\n");
    fprintf(stderr, "                STR has the form language[:key1=val1[,key2[,key3=val3]]].\n");
    fprintf(stderr, "                Keys and values are options passed to the generator.\n");
    fprintf(stderr, "                Many options will not require values.\n");
    fprintf(stderr, "\n");
    fprintf(stderr, "Options related to audit operation\n");
    fprintf(stderr, "   --audit OldFile   Old Thrift file to be audited with 'file'\n");
    fprintf(stderr, "  -Iold dir    Add a directory to the list of directories\n");
    fprintf(stderr, "                searched for include directives for old thrift file\n");
    fprintf(stderr, "  -Inew dir    Add a directory to the list of directories\n");
    fprintf(stderr, "                searched for include directives for new thrift file\n");
    fprintf(stderr, "\n");
    fprintf(stderr, "Available generators (and options):\n");

    t_generator_registry::gen_map_t gen_map = t_generator_registry::get_generator_map();
    t_generator_registry::gen_map_t::iterator iter;
    for (iter = gen_map.begin(); iter != gen_map.end(); ++iter) {
        fprintf(stderr,
                "  %s (%s):\n",
                iter->second->get_short_name().c_str(),
                iter->second->get_long_name().c_str());
        fprintf(stderr, "%s", iter->second->get_documentation().c_str());
    }
    exit(1);
}